

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O2

float Abc_ObjDelay0(Abc_IffMan_t *p,Abc_Obj_t *pObj)

{
  long lVar1;
  float fVar2;
  float fVar3;
  Abc_Obj_t *ppNodes [6];
  
  Abc_ObjSortByDelay(p,pObj,1,ppNodes);
  fVar2 = 0.0;
  for (lVar1 = 0; lVar1 < (pObj->vFanins).nSize; lVar1 = lVar1 + 1) {
    fVar3 = Abc_IffDelay(p,ppNodes[lVar1],1);
    fVar3 = fVar3 + p->pPars->pLutDelays[lVar1];
    if (fVar2 <= fVar3) {
      fVar2 = fVar3;
    }
  }
  return fVar2;
}

Assistant:

float Abc_ObjDelay0( Abc_IffMan_t * p, Abc_Obj_t * pObj )
{
    int i;
    float Delay0 = 0;
    Abc_Obj_t * ppNodes[6];
    Abc_ObjSortByDelay( p, pObj, 1, ppNodes );
    for ( i = 0; i < Abc_ObjFaninNum(pObj); i++ )
        Delay0 = Abc_MaxFloat( Delay0, Abc_IffDelay(p, ppNodes[i], 1) + p->pPars->pLutDelays[i] );
    return Delay0;
}